

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O1

void google::protobuf::compiler::anon_unknown_0::CheckSingleAnnotation
               (string_view expected_file,string_view expected_text,string_view file_content,
               Annotation *annotation)

{
  internal iVar1;
  long *plVar2;
  long *plVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  AssertHelper local_70;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  plVar3 = (long *)file_content._M_len;
  local_48._M_str = expected_text._M_str;
  local_48._M_len = expected_text._M_len;
  local_38._M_str = expected_file._M_str;
  local_38._M_len = expected_file._M_len;
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            (local_68,"expected_file","annotation.source_file()",&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(annotation->field_0)._impl_.source_file_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
             ));
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0xa7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)local_58._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_len + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  local_70.data_._0_4_ = (annotation->field_0)._impl_.begin_;
  local_58._M_len = (size_t)plVar3;
  testing::internal::CmpHelperGE<unsigned_long,int>
            (local_68,"file_content.size()","annotation.begin()",&local_58._M_len,(int *)&local_70);
  iVar1 = local_68[0];
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0xa8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)local_58._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_len + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  if (iVar1 != (internal)0x0) {
    local_70.data_._0_4_ = (annotation->field_0)._impl_.end_;
    local_58._M_len = (size_t)plVar3;
    testing::internal::CmpHelperGE<unsigned_long,int>
              (local_68,"file_content.size()","annotation.end()",&local_58._M_len,(int *)&local_70);
    iVar1 = local_68[0];
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0xa9,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if ((long *)local_58._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_58._M_len + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    if (iVar1 != (internal)0x0) {
      local_58._M_len = CONCAT44(local_58._M_len._4_4_,(annotation->field_0)._impl_.begin_);
      local_70.data_._0_4_ = (annotation->field_0)._impl_.end_;
      testing::internal::CmpHelperLE<int,int>
                (local_68,"annotation.begin()","annotation.end()",(int *)&local_58,(int *)&local_70)
      ;
      iVar1 = local_68[0];
      if (local_68[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_60->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0xaa,pcVar4);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if ((long *)local_58._M_len != (long *)0x0) {
          (**(code **)(*(long *)local_58._M_len + 8))();
        }
      }
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_60,local_60);
      }
      if (iVar1 != (internal)0x0) {
        local_58._M_len = local_48._M_len;
        local_70.data_._0_4_ =
             (annotation->field_0)._impl_.end_ - (annotation->field_0)._impl_.begin_;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  (local_68,"expected_text.size()","annotation.end() - annotation.begin()",
                   &local_58._M_len,(int *)&local_70);
        if (local_68[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_58);
          if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_60->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0xab,pcVar4);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if ((long *)local_58._M_len != (long *)0x0) {
            (**(code **)(*(long *)local_58._M_len + 8))();
          }
        }
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60);
        }
        plVar2 = (long *)(long)(annotation->field_0)._impl_.begin_;
        if (plVar3 < plVar2) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     plVar2,plVar3);
        }
        local_58._M_len = local_48._M_len;
        if ((long *)((long)plVar3 - (long)plVar2) < local_48._M_len) {
          local_58._M_len = (size_t)((long)plVar3 - (long)plVar2);
        }
        local_58._M_str = file_content._M_str + (long)plVar2;
        testing::internal::
        CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  (local_68,"expected_text",
                   "file_content.substr(annotation.begin(), expected_text.size())",&local_48,
                   &local_58);
        if (local_68[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_58);
          if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_60->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                     ,0xad,pcVar4);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if ((long *)local_58._M_len != (long *)0x0) {
            (**(code **)(*(long *)local_58._M_len + 8))();
          }
        }
        if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_60,local_60);
        }
      }
    }
  }
  return;
}

Assistant:

void CheckSingleAnnotation(absl::string_view expected_file,
                           absl::string_view expected_text,
                           absl::string_view file_content,
                           const GeneratedCodeInfo::Annotation& annotation) {
  EXPECT_EQ(expected_file, annotation.source_file());
  ASSERT_GE(file_content.size(), annotation.begin());
  ASSERT_GE(file_content.size(), annotation.end());
  ASSERT_LE(annotation.begin(), annotation.end());
  EXPECT_EQ(expected_text.size(), annotation.end() - annotation.begin());
  EXPECT_EQ(expected_text,
            file_content.substr(annotation.begin(), expected_text.size()));
}